

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# configfile.cpp
# Opt level: O1

bool __thiscall FConfigFile::DeleteCurrentSection(FConfigFile *this)

{
  FConfigSection *pFVar1;
  FConfigSection *pFVar2;
  
  if (this->CurrentSection == (FConfigSection *)0x0) {
    return false;
  }
  ClearCurrentSection(this);
  pFVar1 = this->Sections;
  do {
    pFVar2 = pFVar1;
    if (pFVar2 == (FConfigSection *)0x0) break;
    pFVar1 = pFVar2->Next;
  } while (pFVar2->Next != this->CurrentSection);
  pFVar1 = this->CurrentSection;
  pFVar2->Next = pFVar1->Next;
  if (this->LastSectionPtr == &pFVar1->Next) {
    this->LastSectionPtr = &pFVar2->Next;
  }
  if (pFVar1 != (FConfigSection *)0x0) {
    FString::~FString(&pFVar1->Note);
    FString::~FString(&pFVar1->SectionName);
    operator_delete(pFVar1,0x28);
  }
  pFVar1 = pFVar2->Next;
  this->CurrentSection = pFVar1;
  return pFVar1 != (FConfigSection *)0x0;
}

Assistant:

bool FConfigFile::DeleteCurrentSection()
{
	if (CurrentSection != NULL)
	{
		FConfigSection *sec;

		ClearCurrentSection();

		// Find the preceding section.
		for (sec = Sections; sec != NULL && sec->Next != CurrentSection; sec = sec->Next)
		{ }

		sec->Next = CurrentSection->Next;
		if (LastSectionPtr == &CurrentSection->Next)
		{
			LastSectionPtr = &sec->Next;
		}

		delete CurrentSection;

		CurrentSection = sec->Next;
		return CurrentSection != NULL;
	}
	return false;
}